

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

int __thiscall bdNodeManager::checkBadPeerStatus(bdNodeManager *this)

{
  undefined4 flags_00;
  bool bVar1;
  string local_88;
  string local_58 [8];
  string nullstr;
  uint32_t flags;
  bdId id;
  bdNodeManager *this_local;
  
  bdId::bdId((bdId *)((long)&nullstr.field_2 + 0xc));
  std::__cxx11::string::string(local_58);
  while( true ) {
    bVar1 = bdPeerQueue::popPeer
                      (&(this->super_bdNode).mBadPeerQueue,(bdId *)((long)&nullstr.field_2 + 0xc),
                       (uint32_t *)(nullstr.field_2._M_local_buf + 8));
    flags_00 = nullstr.field_2._8_4_;
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&local_88,local_58);
    doInfoCallback(this,(bdId *)((long)&nullstr.field_2 + 0xc),1,flags_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::~string(local_58);
  return 1;
}

Assistant:

int bdNodeManager::checkBadPeerStatus() {
	bdId id;
	uint32_t flags;
	std::string nullstr;

	while(mBadPeerQueue.popPeer(&id, flags))
		doInfoCallback(&id, BITDHT_INFO_CB_TYPE_BADPEER, flags, nullstr);
	return 1;
}